

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.cpp
# Opt level: O1

size_t duckdb_zstd::FSE_normalizeCount
                 (short *normalizedCounter,uint tableLog,uint *count,size_t total,
                 uint maxSymbolValue,uint useLowProbCount)

{
  undefined1 auVar1 [16];
  char cVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  U32 lowThreshold;
  uint uVar18;
  ushort uVar19;
  U64 vStepLog;
  
  uVar9 = 0xb;
  if (tableLog != 0) {
    uVar9 = tableLog;
  }
  if (uVar9 < 5) {
    return 0xffffffffffffffff;
  }
  if (0xc < uVar9) {
    return 0xffffffffffffffd4;
  }
  uVar6 = 0x1f;
  if ((uint)total != 0) {
    for (; (uint)total >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  uVar4 = (uVar6 ^ 0xffffffe0) + 0x21;
  uVar6 = 0x1f;
  if (maxSymbolValue != 0) {
    for (; maxSymbolValue >> uVar6 == 0; uVar6 = uVar6 - 1) {
    }
  }
  uVar6 = (uVar6 ^ 0xffffffe0) + 0x22;
  if (uVar4 < uVar6) {
    uVar6 = uVar4;
  }
  if (uVar9 < uVar6) {
    return 0xffffffffffffffff;
  }
  uVar19 = -(ushort)(useLowProbCount != 0) | 1;
  bVar3 = (byte)uVar9;
  cVar2 = -bVar3;
  bVar5 = cVar2 + 0x3e;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = total & 0xffffffff;
  iVar16 = 1 << (bVar3 & 0x1f);
  uVar4 = 0;
  uVar6 = 0;
  uVar8 = 0;
  iVar17 = iVar16;
  do {
    uVar14 = (ulong)count[uVar8];
    if (uVar14 == total) {
      return 0;
    }
    uVar18 = (uint)(total >> (bVar3 & 0x3f));
    if (uVar14 == 0) {
      normalizedCounter[uVar8] = 0;
    }
    else if (uVar18 < count[uVar8]) {
      uVar14 = uVar14 * SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar1,0);
      uVar12 = uVar14 >> (bVar5 & 0x3f);
      uVar10 = (uint)uVar12;
      if ((uVar12 & 0xfff8) == 0) {
        uVar10 = uVar10 + ((ulong)FSE_normalizeCount::rtbTable[uVar12 & 0xffff] <<
                           (cVar2 + 0x2aU & 0x3f) < uVar14 - ((uVar12 & 0xffff) << (bVar5 & 0x3f)));
      }
      if ((ushort)uVar4 < (ushort)uVar10) {
        uVar4 = uVar10 & 0xffff;
        uVar6 = uVar8;
      }
      normalizedCounter[uVar8] = (ushort)uVar10;
      iVar17 = iVar17 - (uVar10 & 0xffff);
    }
    else {
      normalizedCounter[uVar8] = uVar19;
      iVar17 = iVar17 + -1;
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 <= maxSymbolValue);
  iVar11 = (int)normalizedCounter[uVar6] >> 1;
  if (iVar11 != -iVar17 && SBORROW4(iVar11,-iVar17) == iVar11 + iVar17 < 0) {
    normalizedCounter[uVar6] = normalizedCounter[uVar6] + (short)iVar17;
    return (ulong)uVar9;
  }
  uVar13 = total * 3 >> (bVar3 + 1 & 0x3f);
  uVar6 = maxSymbolValue + 1;
  uVar12 = (ulong)(maxSymbolValue + 1 + (uint)(uVar6 == 0));
  uVar14 = 0;
  uVar4 = 0;
  do {
    uVar8 = count[uVar14];
    if ((ulong)uVar8 == 0) {
      normalizedCounter[uVar14] = 0;
    }
    else {
      if (uVar18 < uVar8) {
        if ((uint)uVar13 < uVar8) {
          normalizedCounter[uVar14] = -2;
          goto LAB_0038e358;
        }
        normalizedCounter[uVar14] = 1;
      }
      else {
        normalizedCounter[uVar14] = uVar19;
      }
      uVar4 = uVar4 + 1;
      total = total - uVar8;
    }
LAB_0038e358:
    uVar14 = uVar14 + 1;
  } while (uVar12 != uVar14);
  uVar8 = iVar16 - uVar4;
  if (uVar8 != 0) {
    if ((uVar13 & 0xffffffff) < total / uVar8) {
      uVar14 = total * 3;
      uVar13 = 0;
      do {
        if ((normalizedCounter[uVar13] == -2) &&
           (uVar18 = count[uVar13], uVar18 <= (uint)(uVar14 / (uVar8 * 2)))) {
          normalizedCounter[uVar13] = 1;
          uVar4 = uVar4 + 1;
          total = total - uVar18;
        }
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
      uVar8 = iVar16 - uVar4;
    }
    if (uVar4 != uVar6) {
      if (total == 0) {
        uVar14 = 0;
        if (uVar8 != 0) {
          uVar12 = 0;
          do {
            if (0 < normalizedCounter[uVar12]) {
              uVar8 = uVar8 - 1;
              normalizedCounter[uVar12] = normalizedCounter[uVar12] + 1;
            }
            uVar12 = (ulong)((int)uVar12 + 1) % (ulong)uVar6;
          } while (uVar8 != 0);
        }
      }
      else {
        uVar12 = ~(-1L << (cVar2 + 0x3dU & 0x3f));
        uVar14 = ((ulong)uVar8 << (bVar5 & 0x3f)) + uVar12;
        uVar6 = 0;
        bVar7 = true;
        do {
          if (normalizedCounter[uVar6] == -2) {
            uVar15 = uVar12 >> (bVar5 & 0x3f);
            uVar12 = (ulong)count[uVar6] * (uVar14 / (total & 0xffffffff)) + uVar12;
            uVar13 = uVar12 >> (bVar5 & 0x3f);
            if (uVar13 == uVar15) break;
            normalizedCounter[uVar6] = (short)uVar13 - (short)uVar15;
          }
          uVar6 = uVar6 + 1;
          bVar7 = uVar6 <= maxSymbolValue;
        } while (uVar6 <= maxSymbolValue);
        uVar14 = -(ulong)bVar7;
      }
      goto LAB_0038e49f;
    }
    uVar14 = 0;
    uVar4 = 0;
    uVar6 = 0;
    do {
      if (uVar4 < count[uVar14]) {
        uVar4 = count[uVar14];
        uVar6 = (uint)uVar14;
      }
      uVar14 = uVar14 + 1;
    } while (uVar12 != uVar14);
    normalizedCounter[uVar6] = normalizedCounter[uVar6] + (short)uVar8;
  }
  uVar14 = 0;
LAB_0038e49f:
  uVar12 = (ulong)uVar9;
  if (0xffffffffffffff88 < uVar14) {
    uVar12 = uVar14;
  }
  return uVar12;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue, unsigned useLowProbCount)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        short const lowProbCount = useLowProbCount ? -1 : 1;
        U64 const scale = 62 - tableLog;
        U64 const step = ZSTD_div64((U64)1<<62, (U32)total);   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = lowProbCount;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue, lowProbCount);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}